

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_node.cpp
# Opt level: O0

void __thiscall xscript::parser::ast_node::ast_node(ast_node *this)

{
  ast_node *this_local;
  
  this->parent = (ast_node *)0x0;
  std::
  vector<std::unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>,_std::allocator<std::unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>_>_>
  ::vector(&this->children);
  this->type = ROOT;
  tokenizer::token::token(&this->token);
  std::shared_ptr<xscript::parser::symbol_table>::shared_ptr(&this->symbols);
  std::shared_ptr<xscript::parser::register_allocator>::shared_ptr(&this->regs);
  return;
}

Assistant:

ast_node::ast_node() :
    parent(nullptr),
    type(ROOT)
{

}